

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O3

void BrotliOptimizeHistograms
               (size_t num_direct_distance_codes,size_t distance_postfix_bits,MetaBlockSplit *mb)

{
  ulong uVar1;
  long lVar2;
  uint8_t good_for_rle [704];
  uint8_t auStack_2f8 [712];
  
  if (mb->literal_histograms_size != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      BrotliOptimizeHuffmanCountsForRle
                (0x100,(uint32_t *)((long)mb->literal_histograms->data_ + lVar2),auStack_2f8);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x410;
    } while (uVar1 < mb->literal_histograms_size);
  }
  if (mb->command_histograms_size != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      BrotliOptimizeHuffmanCountsForRle
                (0x2c0,(uint32_t *)((long)mb->command_histograms->data_ + lVar2),auStack_2f8);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0xb10;
    } while (uVar1 < mb->command_histograms_size);
  }
  if (mb->distance_histograms_size != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      BrotliOptimizeHuffmanCountsForRle
                (num_direct_distance_codes + (uint)(0x30 << ((byte)distance_postfix_bits & 0x1f)) +
                 0x10,(uint32_t *)((long)mb->distance_histograms->data_ + lVar2),auStack_2f8);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x830;
    } while (uVar1 < mb->distance_histograms_size);
  }
  return;
}

Assistant:

void BrotliOptimizeHistograms(size_t num_direct_distance_codes,
                              size_t distance_postfix_bits,
                              MetaBlockSplit* mb) {
  uint8_t good_for_rle[BROTLI_NUM_COMMAND_SYMBOLS];
  size_t num_distance_codes;
  size_t i;
  for (i = 0; i < mb->literal_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(256, mb->literal_histograms[i].data_,
                                      good_for_rle);
  }
  for (i = 0; i < mb->command_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(BROTLI_NUM_COMMAND_SYMBOLS,
                                      mb->command_histograms[i].data_,
                                      good_for_rle);
  }
  num_distance_codes = BROTLI_NUM_DISTANCE_SHORT_CODES +
      num_direct_distance_codes +
      ((2 * BROTLI_MAX_DISTANCE_BITS) << distance_postfix_bits);
  for (i = 0; i < mb->distance_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(num_distance_codes,
                                      mb->distance_histograms[i].data_,
                                      good_for_rle);
  }
}